

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mvref_common.c
# Opt level: O0

void scan_col_mbmi(AV1_COMMON *cm,MACROBLOCKD *xd,int mi_row,MV_REFERENCE_FRAME *rf,int col_offset,
                  CANDIDATE_MV *ref_mv_stack,uint16_t *ref_mv_weight,uint8_t *refmv_count,
                  uint8_t *ref_match_count,uint8_t *newmv_count,int_mv *gm_mv_candidates,
                  int max_col_offset,int *processed_cols)

{
  byte bVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  uint in_EDX;
  long in_RSI;
  long in_RDI;
  int in_R8D;
  undefined8 in_R9;
  int in_stack_00000030;
  int *in_stack_00000038;
  int inc;
  int weight;
  int len;
  int n4_h;
  int candidate_bsize;
  MB_MODE_INFO *candidate;
  int use_step_16;
  int row_offset;
  int i;
  int n8_h_16;
  int n8_h_8;
  int end_mi;
  uint in_stack_ffffffffffffff78;
  uint in_stack_ffffffffffffff7c;
  uint in_stack_ffffffffffffff80;
  uint in_stack_ffffffffffffff84;
  uint uVar7;
  uint uVar8;
  uint in_stack_ffffffffffffff94;
  uint uVar9;
  uint uVar10;
  int iVar11;
  int iVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  uint uVar15;
  
  if ((int)(uint)*(byte *)(in_RSI + 0x2075) < (int)(*(int *)(in_RDI + 0x214) - in_EDX)) {
    uVar2 = (uint)*(byte *)(in_RSI + 0x2075);
  }
  else {
    uVar2 = *(int *)(in_RDI + 0x214) - in_EDX;
  }
  uVar8 = uVar2;
  if (0xf < (int)uVar2) {
    uVar8 = 0x10;
  }
  uVar14 = 2;
  uVar13 = 4;
  iVar11 = 0;
  iVar12 = in_R8D;
  if (in_R8D < 1) {
    iVar12 = -in_R8D;
  }
  if (((1 < iVar12) && (iVar11 = 1, (in_EDX & 1) != 0)) && (*(byte *)(in_RSI + 0x2075) < 2)) {
    iVar11 = 0;
  }
  uVar3 = (uint)(0xf < *(byte *)(in_RSI + 0x2075));
  uVar15 = uVar8;
  for (iVar12 = 0; iVar12 < (int)uVar15; iVar12 = uVar10 + iVar12) {
    bVar1 = **(byte **)(*(long *)(in_RSI + 0x1eb8) +
                       (long)((iVar11 + iVar12) * *(int *)(in_RSI + 8) + in_R8D) * 8);
    uVar4 = (uint)bVar1;
    uVar5 = (uint)"\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                  [(int)uVar4];
    uVar7 = uVar5;
    if (*(byte *)(in_RSI + 0x2075) < uVar5) {
      uVar7 = (uint)*(byte *)(in_RSI + 0x2075);
    }
    uVar10 = uVar7;
    if (uVar3 == 0) {
      iVar6 = in_R8D;
      if (in_R8D < 1) {
        iVar6 = -in_R8D;
      }
      if ((1 < iVar6) && (in_stack_ffffffffffffff80 = uVar7, uVar7 < 3)) {
        in_stack_ffffffffffffff80 = 2;
        uVar10 = 2;
      }
    }
    else {
      in_stack_ffffffffffffff84 = uVar7;
      if (uVar7 < 4) {
        in_stack_ffffffffffffff84 = 4;
        uVar10 = 4;
      }
    }
    uVar9 = 2;
    if ((1 < *(byte *)(in_RSI + 0x2075)) && (*(byte *)(in_RSI + 0x2075) <= uVar5)) {
      if ((in_R8D - in_stack_00000030) + 1 <
          (int)(uint)"\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                     [(int)uVar4]) {
        in_stack_ffffffffffffff7c = (in_R8D - in_stack_00000030) + 1;
      }
      else {
        in_stack_ffffffffffffff7c =
             (uint)"\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                   [(int)uVar4];
      }
      in_stack_ffffffffffffff78 = in_stack_ffffffffffffff7c;
      if ((int)in_stack_ffffffffffffff7c < 2) {
        in_stack_ffffffffffffff78 = 2;
      }
      *in_stack_00000038 = (in_stack_ffffffffffffff7c - in_R8D) + -1;
      in_stack_ffffffffffffff94 = in_stack_ffffffffffffff7c;
      uVar9 = in_stack_ffffffffffffff78;
    }
    add_ref_mv_candidate
              ((MB_MODE_INFO *)(ulong)CONCAT14(bVar1,uVar5),
               (MV_REFERENCE_FRAME *)CONCAT44(uVar10,uVar9),
               (uint8_t *)CONCAT44(in_stack_ffffffffffffff94,uVar2),(uint8_t *)CONCAT44(uVar8,uVar7)
               ,(uint8_t *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
               (CANDIDATE_MV *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
               (uint16_t *)CONCAT44(iVar11,uVar3),(int_mv *)CONCAT44(uVar13,iVar12),
               (WarpedMotionParams *)CONCAT44(uVar15,uVar14),(uint16_t)in_R9);
  }
  return;
}

Assistant:

static inline void scan_col_mbmi(const AV1_COMMON *cm, const MACROBLOCKD *xd,
                                 int mi_row, const MV_REFERENCE_FRAME rf[2],
                                 int col_offset, CANDIDATE_MV *ref_mv_stack,
                                 uint16_t *ref_mv_weight, uint8_t *refmv_count,
                                 uint8_t *ref_match_count, uint8_t *newmv_count,
                                 int_mv *gm_mv_candidates, int max_col_offset,
                                 int *processed_cols) {
  int end_mi = AOMMIN(xd->height, cm->mi_params.mi_rows - mi_row);
  end_mi = AOMMIN(end_mi, mi_size_high[BLOCK_64X64]);
  const int n8_h_8 = mi_size_high[BLOCK_8X8];
  const int n8_h_16 = mi_size_high[BLOCK_16X16];
  int i;
  int row_offset = 0;
  if (abs(col_offset) > 1) {
    row_offset = 1;
    if ((mi_row & 0x01) && xd->height < n8_h_8) --row_offset;
  }
  const int use_step_16 = (xd->height >= 16);

  for (i = 0; i < end_mi;) {
    const MB_MODE_INFO *const candidate =
        xd->mi[(row_offset + i) * xd->mi_stride + col_offset];
    const int candidate_bsize = candidate->bsize;
    const int n4_h = mi_size_high[candidate_bsize];
    int len = AOMMIN(xd->height, n4_h);
    if (use_step_16)
      len = AOMMAX(n8_h_16, len);
    else if (abs(col_offset) > 1)
      len = AOMMAX(len, n8_h_8);

    int weight = 2;
    if (xd->height >= n8_h_8 && xd->height <= n4_h) {
      int inc = AOMMIN(-max_col_offset + col_offset + 1,
                       mi_size_wide[candidate_bsize]);
      // Obtain range used in weight calculation.
      weight = AOMMAX(weight, inc);
      // Update processed cols.
      *processed_cols = inc - col_offset - 1;
    }

    add_ref_mv_candidate(candidate, rf, refmv_count, ref_match_count,
                         newmv_count, ref_mv_stack, ref_mv_weight,
                         gm_mv_candidates, cm->global_motion, len * weight);

    i += len;
  }
}